

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

void __thiscall NameServer::generateSplitInfo(NameServer *this)

{
  double dVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>,_bool>
  pVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>,_bool>
  pVar3;
  __cxx11 local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  local_278;
  int local_23c;
  _Base_ptr local_238;
  int local_22c;
  pair<int,_fileRange> local_228;
  int local_20c;
  iterator iStack_208;
  int j;
  int local_1fc;
  pair<int,_fileRange> local_1f8;
  undefined1 local_1e0 [8];
  fileRange range;
  undefined1 local_1c8 [8];
  vector<int,_std::allocator<int>_> _serverids;
  int i_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  __cxx11 local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [36];
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockPathList;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>
  local_d0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>
  local_88;
  pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>
  local_60;
  int local_2c;
  fpos afStack_28 [4];
  int blockNum;
  undefined8 local_20;
  long local_18;
  longlong length;
  NameServer *this_local;
  
  length = (longlong)this;
  std::istream::seekg(0x185828,_S_beg);
  _afStack_28 = std::istream::tellg();
  local_18 = std::fpos::operator_cast_to_long(afStack_28);
  std::istream::seekg(0x185828,_S_beg);
  dVar1 = ceil((double)local_18 * 4.76837158203125e-07);
  local_2c = (int)dVar1;
  std::make_pair<std::__cxx11::string&,long_long&>
            (&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             desFileName_abi_cxx11_,&local_18);
  std::make_pair<int&,std::pair<std::__cxx11::string,long_long>>(&local_60,&fileID,&local_88);
  pVar2 = std::
          map<int,std::pair<std::__cxx11::string,long_long>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>>
          ::emplace<std::pair<int,std::pair<std::__cxx11::string,long_long>>>
                    ((map<int,std::pair<std::__cxx11::string,long_long>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>>
                      *)&fileid_path_lenMap_abi_cxx11_,&local_60);
  local_a8 = (_Base_ptr)pVar2.first._M_node;
  local_a0 = pVar2.second;
  std::
  pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>
  ::~pair(&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>::
  ~pair(&local_88);
  std::make_pair<std::__cxx11::string&,long_long&>
            (&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             desFileName_abi_cxx11_,&local_18);
  pVar3 = std::
          map<std::__cxx11::string,long_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long_long>>>
          ::emplace<std::pair<std::__cxx11::string,long_long>>
                    ((map<std::__cxx11::string,long_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long_long>>>
                      *)&path_lenMap_abi_cxx11_,&local_d0);
  blockPathList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar3.first._M_node;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>::
  ~pair(&local_d0);
  fileID = fileID + 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f8);
  for (local_fc = 0; local_fc < local_2c; local_fc = local_fc + 1) {
    std::operator+(local_140,desFileName_abi_cxx11_);
    std::__cxx11::to_string(local_160,local_fc);
    std::operator+(local_120,local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8,local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_140);
  }
  std::
  make_pair<std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (&local_198,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             desFileName_abi_cxx11_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8);
  std::
  map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  ::
  emplace<std::pair<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              *)&logicFile_BlockFileMap_abi_cxx11_,&local_198);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair(&local_198);
  for (_serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_ = 0;
      _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ < local_2c;
      _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ + 1) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_1c8);
    range.blockId =
         _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ % dataserver_num;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_1c8,&range.blockId);
    fileRange::fileRange
              ((fileRange *)local_1e0,
               (long)(_serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ << 0x15),0,
               _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    if (_serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ == local_2c + -1) {
      range.from._0_4_ =
           (int)local_18 +
           _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_ * -0x200000;
    }
    else {
      range.from._0_4_ = 0x200000;
    }
    local_1fc = _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ % dataserver_num;
    std::make_pair<int,fileRange&>(&local_1f8,&local_1fc,(fileRange *)local_1e0);
    iStack_208 = std::
                 multimap<int,fileRange,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                 ::emplace<std::pair<int,fileRange>>
                           ((multimap<int,fileRange,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                             *)&server_fileRangesMap,&local_1f8);
    for (local_20c = 1; local_20c < replicate_num; local_20c = local_20c + 1) {
      local_22c = (_serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + local_20c) % dataserver_num;
      std::make_pair<int,fileRange&>(&local_228,&local_22c,(fileRange *)local_1e0);
      local_238 = (_Base_ptr)
                  std::
                  multimap<int,fileRange,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                  ::emplace<std::pair<int,fileRange>>
                            ((multimap<int,fileRange,std::less<int>,std::allocator<std::pair<int_const,fileRange>>>
                              *)&server_fileRangesMap,&local_228);
      local_23c = (_serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ + local_20c) % dataserver_num;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_1c8,&local_23c);
    }
    std::operator+(local_2b8,desFileName_abi_cxx11_);
    std::__cxx11::to_string
              (local_2d8,
               _serverids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_);
    std::operator+(local_298,local_2b8);
    std::make_pair<std::__cxx11::string,std::vector<int,std::allocator<int>>&>
              (&local_278,local_298,(vector<int,_std::allocator<int>_> *)local_1c8);
    std::
    map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
    ::emplace<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>
              ((map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                *)&block_serversMap_abi_cxx11_,&local_278);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::~pair(&local_278);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1c8);
  }
  writeMeta(this,id_file);
  writeMeta(this,file_len);
  writeMeta(this,file_block);
  writeMeta(this,block_server);
  writeMeta(this,current_id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  return;
}

Assistant:

void generateSplitInfo() const
    {
        ifs.seekg (0, ifs.end);
        long long length = ifs.tellg();
        ifs.seekg (0, ifs.beg);

        int blockNum = (int)ceil(length / block_size);

        // metadata: key=fileId, value=logicFilePath
        fileid_path_lenMap.emplace(make_pair(fileID, make_pair(desFileName, length)));
        path_lenMap.emplace(make_pair(desFileName, length));

        fileID++;

        vector<string> blockPathList;
        for (int i = 0; i < blockNum; i++)
        {
            blockPathList.push_back(desFileName + "-part" + to_string(i));
        }
        logicFile_BlockFileMap.emplace(make_pair(desFileName, blockPathList));

        for (int i = 0; i < blockNum; i++)
        {

            vector<int> _serverids;
            _serverids.push_back(i % dataserver_num);

            fileRange range(i * block_size_int, 0, i);

            if (i == blockNum - 1)
            {
                range.count = length - i * block_size_int;
            }
            else
            {
                range.count = block_size_int;
            }
            server_fileRangesMap.emplace(make_pair(i % dataserver_num, range));
            // still should crate another two replications
            for (int j = 1; j < replicate_num; j++)
            {
                server_fileRangesMap.emplace(make_pair((i + j) % dataserver_num, range));

                _serverids.push_back((i + j) % dataserver_num);
            }

            block_serversMap.emplace(make_pair(desFileName + "-part" + to_string(i),
               _serverids));
        }

        // write metadata info to file
        writeMeta(MetaType::id_file);
        writeMeta(MetaType::file_len);
        writeMeta(MetaType::file_block);
        writeMeta(MetaType::block_server);
        writeMeta(MetaType::current_id);

    }